

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.c
# Opt level: O1

void fft_equalize(fft_window_data *data,void *user)

{
  float fVar1;
  uint uVar2;
  float *pfVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint32_t i;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  uVar2 = (uint)data->framesize;
  pfVar3 = data->fft_workspace;
  if (uVar2 != 0) {
    uVar9 = 0;
    do {
      fVar12 = pfVar3[uVar9];
      uVar10 = (int)uVar9 + 1;
      fVar15 = pfVar3[uVar10];
      fVar14 = fVar12 * fVar12 + fVar15 * fVar15;
      if (fVar14 < 0.0) {
        fVar14 = sqrtf(fVar14);
      }
      else {
        auVar17 = vsqrtss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14));
        fVar14 = auVar17._0_4_;
      }
      pfVar3[uVar9] = fVar14 + fVar14;
      fVar12 = atan2f(fVar15,fVar12);
      pfVar3[uVar10] = fVar12;
      uVar10 = (int)uVar9 + 2;
      uVar9 = (ulong)uVar10;
    } while (uVar10 < uVar2);
  }
  if (uVar2 != 0) {
    uVar11 = uVar2 >> 4;
    uVar10 = 0;
    do {
      uVar9 = (ulong)uVar10;
      auVar17._0_8_ = (double)((float)uVar9 / (float)uVar2);
      auVar17._8_8_ = 0;
      if (auVar17._0_8_ < 0.0) {
        dVar16 = sqrt(auVar17._0_8_);
      }
      else {
        auVar17 = vsqrtsd_avx(auVar17,auVar17);
        dVar16 = auVar17._0_8_;
      }
      auVar18._8_8_ = 0;
      auVar18._0_8_ = (double)(uVar2 >> 1) * dVar16;
      auVar17 = vroundsd_avx(auVar18,auVar18,9);
      uVar4 = (ulong)(uint)(int)auVar17._0_8_ / (ulong)uVar11;
      iVar5 = (int)uVar4;
      uVar6 = 1;
      if (1 < iVar5) {
        uVar6 = uVar4;
      }
      uVar7 = 2;
      if (2 < iVar5) {
        uVar7 = uVar4;
      }
      iVar8 = 6;
      if (iVar5 < 6) {
        iVar8 = iVar5;
      }
      fVar13 = (float)((uint)(int)auVar17._0_8_ % uVar11) / (float)uVar11;
      fVar12 = *(float *)((long)user + uVar7 * 4 + 0x60);
      fVar15 = *(float *)((long)user + uVar6 * 4 + 100);
      fVar14 = *(float *)((long)user + (long)iVar5 * 4 + 0x68);
      fVar1 = *(float *)((long)user + (long)iVar8 * 4 + 0x6c);
      pfVar3[uVar9] =
           (fVar13 * fVar13 * (fVar14 * -3.0 + (fVar15 * 3.0 - fVar12) + fVar1) * fVar13 +
           fVar13 * ((fVar14 * 4.0 + fVar12 + fVar12 + fVar15 * -5.0) - fVar1) * fVar13 +
           fVar15 + fVar15 + fVar13 * (fVar14 - fVar12)) * 0.5 * pfVar3[uVar9];
      uVar10 = uVar10 + 2;
    } while (uVar10 < uVar2);
    uVar10 = 0;
    do {
      fVar12 = pfVar3[uVar10];
      fVar15 = pfVar3[uVar10 + 1];
      fVar14 = cosf(fVar15);
      pfVar3[uVar10] = fVar14 * fVar12;
      fVar15 = sinf(fVar15);
      pfVar3[uVar10 + 1] = fVar15 * fVar12;
      uVar10 = uVar10 + 2;
    } while (uVar10 < uVar2);
  }
  return;
}

Assistant:

VECTORIZE void fft_equalize(struct fft_window_data *data, void *user){
  struct equalizer_segment_data *user_data = (struct equalizer_segment_data *)user;
  uint32_t framesize = data->framesize;
  float *fft_workspace = data->fft_workspace;
  float *bands = user_data->bands;

  // Change to mag/phase
  for(uint32_t i = 0; i < framesize; i+= 2){
    float re = fft_workspace[i+0];
    float im = fft_workspace[i+1];
    fft_workspace[i+0] = sqrtf(re * re + im * im) * 2;
    fft_workspace[i+1] = atan2f(im, re);
  }

  // Perform band eq
  for(uint32_t p = 0; p < framesize; p+= 2){
    int i = (int)floor(sqrt(p / (float)(framesize)) * (framesize / 2));
	int p2 = (i / (framesize / 16));
	int p1 = p2 - 1;
	int p0 = p1 - 1;
	int p3 = p2 + 1;
	if (p1 < 0) p1 = 0;
	if (p0 < 0) p0 = 0;
	if (p3 > 7) p3 = 7;
	float v = (float)(i % (framesize / 16)) / (float)(framesize / 16);
	fft_workspace[p] *= catmullrom(v, bands[p0], bands[p1], bands[p2], bands[p3]);
  }

  // Change back to complex
  for(uint32_t i = 0; i < framesize; i+= 2){
	float mag = fft_workspace[i+0];
	float pha = fft_workspace[i+1];
	fft_workspace[i+0] = cosf(pha) * mag;
	fft_workspace[i+1] = sinf(pha) * mag;
  }
}